

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<arg_res_tuple<float,_2UL>_> * __thiscall
Catch::Generators::
makeGenerators<arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>>
          (Generators<arg_res_tuple<float,_2UL>_> *__return_storage_ptr__,Generators *this,
          arg_res_tuple<float,_2UL> *val,arg_res_tuple<float,_2UL> *moreGenerators,
          arg_res_tuple<float,_2UL> *moreGenerators_1,arg_res_tuple<float,_2UL> *moreGenerators_2,
          arg_res_tuple<float,_2UL> *moreGenerators_3,arg_res_tuple<float,_2UL> *moreGenerators_4,
          arg_res_tuple<float,_2UL> *moreGenerators_5,arg_res_tuple<float,_2UL> *moreGenerators_6,
          arg_res_tuple<float,_2UL> *moreGenerators_7,arg_res_tuple<float,_2UL> *moreGenerators_8,
          arg_res_tuple<float,_2UL> *moreGenerators_9,arg_res_tuple<float,_2UL> *moreGenerators_10,
          arg_res_tuple<float,_2UL> *moreGenerators_11,arg_res_tuple<float,_2UL> *moreGenerators_12,
          arg_res_tuple<float,_2UL> *moreGenerators_13,arg_res_tuple<float,_2UL> *moreGenerators_14,
          arg_res_tuple<float,_2UL> *moreGenerators_15,arg_res_tuple<float,_2UL> *moreGenerators_16,
          arg_res_tuple<float,_2UL> *moreGenerators_17,arg_res_tuple<float,_2UL> *moreGenerators_18,
          arg_res_tuple<float,_2UL> *moreGenerators_19,arg_res_tuple<float,_2UL> *moreGenerators_20,
          arg_res_tuple<float,_2UL> *moreGenerators_21,arg_res_tuple<float,_2UL> *moreGenerators_22,
          arg_res_tuple<float,_2UL> *moreGenerators_23,arg_res_tuple<float,_2UL> *moreGenerators_24,
          arg_res_tuple<float,_2UL> *moreGenerators_25,arg_res_tuple<float,_2UL> *moreGenerators_26,
          arg_res_tuple<float,_2UL> *moreGenerators_27,arg_res_tuple<float,_2UL> *moreGenerators_28,
          arg_res_tuple<float,_2UL> *moreGenerators_29,arg_res_tuple<float,_2UL> *moreGenerators_30,
          arg_res_tuple<float,_2UL> *moreGenerators_31,arg_res_tuple<float,_2UL> *moreGenerators_32,
          arg_res_tuple<float,_2UL> *moreGenerators_33,arg_res_tuple<float,_2UL> *moreGenerators_34,
          arg_res_tuple<float,_2UL> *moreGenerators_35,arg_res_tuple<float,_2UL> *moreGenerators_36,
          arg_res_tuple<float,_2UL> *moreGenerators_37,arg_res_tuple<float,_2UL> *moreGenerators_38,
          arg_res_tuple<float,_2UL> *moreGenerators_39,arg_res_tuple<float,_2UL> *moreGenerators_40,
          arg_res_tuple<float,_2UL> *moreGenerators_41)

{
  long *local_38;
  
  value<arg_res_tuple<float,2ul>>((Generators *)&local_38,(arg_res_tuple<float,_2UL> *)this);
  Generators<arg_res_tuple<float,2ul>>::
  Generators<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,2ul>>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>,arg_res_tuple<float,2ul>>
            ((Generators<arg_res_tuple<float,2ul>> *)__return_storage_ptr__,
             (GeneratorWrapper<arg_res_tuple<float,_2UL>_> *)&local_38,val,moreGenerators,
             moreGenerators_1,moreGenerators_2,moreGenerators_3,moreGenerators_4,moreGenerators_5,
             moreGenerators_6,moreGenerators_7,moreGenerators_8,moreGenerators_9,moreGenerators_10,
             moreGenerators_11,moreGenerators_12,moreGenerators_13,moreGenerators_14,
             moreGenerators_15,moreGenerators_16,moreGenerators_17,moreGenerators_18,
             moreGenerators_19,moreGenerators_20,moreGenerators_21,moreGenerators_22,
             moreGenerators_23,moreGenerators_24,moreGenerators_25,moreGenerators_26,
             moreGenerators_27,moreGenerators_28,moreGenerators_29,moreGenerators_30,
             moreGenerators_31,moreGenerators_32,moreGenerators_33,moreGenerators_34,
             moreGenerators_35,moreGenerators_36,moreGenerators_37,moreGenerators_38,
             moreGenerators_39,moreGenerators_40);
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }